

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netban.cpp
# Opt level: O0

void CNetBan::ConBans(IResult *pResult,void *pUser)

{
  IConsole *pIVar1;
  ulong uVar2;
  CNetBan *in_RSI;
  undefined8 in_RDI;
  char *pcVar3;
  long in_FS_OFFSET;
  CBanRange *pBan_1;
  CBanAddr *pBan;
  int Count;
  CNetBan *pThis;
  char aMsg [256];
  char aBuf [256];
  CBan<CNetRange> *local_238;
  CBan<NETADDR> *local_230;
  uint local_224;
  CNetBan *pLastInfoQuery;
  char *in_stack_fffffffffffffdf8;
  CBan<CNetRange> *in_stack_fffffffffffffe00;
  CNetBan *in_stack_fffffffffffffe08;
  undefined1 local_108 [256];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_224 = 0;
  pLastInfoQuery = in_RSI;
  for (local_230 = CBanPool<NETADDR,_1>::First(&in_RSI->m_BanAddrPool);
      local_230 != (CBan<NETADDR> *)0x0; local_230 = local_230->m_pNext) {
    MakeBanInfo<NETADDR>
              (in_stack_fffffffffffffe08,(CBan<NETADDR> *)in_stack_fffffffffffffe00,
               in_stack_fffffffffffffdf8,(uint)((ulong)in_RDI >> 0x20),(int)in_RDI,
               (int *)pLastInfoQuery);
    uVar2 = (ulong)local_224;
    local_224 = local_224 + 1;
    str_format(&stack0xfffffffffffffdf8,0x100,"#%i %s",uVar2,local_108);
    pIVar1 = Console(in_RSI);
    (*(pIVar1->super_IInterface)._vptr_IInterface[0x19])
              (pIVar1,0,"net_ban",&stack0xfffffffffffffdf8);
  }
  for (local_238 = CBanPool<CNetRange,_16>::First(&in_RSI->m_BanRangePool);
      local_238 != (CBan<CNetRange> *)0x0; local_238 = local_238->m_pNext) {
    MakeBanInfo<CNetRange>
              (in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
               (uint)((ulong)in_RDI >> 0x20),(int)in_RDI,(int *)pLastInfoQuery);
    uVar2 = (ulong)local_224;
    local_224 = local_224 + 1;
    str_format(&stack0xfffffffffffffdf8,0x100,"#%i %s",uVar2,local_108);
    pIVar1 = Console(in_RSI);
    (*(pIVar1->super_IInterface)._vptr_IInterface[0x19])
              (pIVar1,0,"net_ban",&stack0xfffffffffffffdf8);
  }
  pcVar3 = "bans";
  if (local_224 == 1) {
    pcVar3 = "ban";
  }
  str_format(&stack0xfffffffffffffdf8,0x100,"%d %s",(ulong)local_224,pcVar3);
  pIVar1 = Console(in_RSI);
  (*(pIVar1->super_IInterface)._vptr_IInterface[0x19])(pIVar1,0,"net_ban",&stack0xfffffffffffffdf8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CNetBan::ConBans(IConsole::IResult *pResult, void *pUser)
{
	CNetBan *pThis = static_cast<CNetBan *>(pUser);

	int Count = 0;
	char aBuf[256], aMsg[256];
	for(CBanAddr *pBan = pThis->m_BanAddrPool.First(); pBan; pBan = pBan->m_pNext)
	{
		pThis->MakeBanInfo(pBan, aBuf, sizeof(aBuf), MSGTYPE_LIST);
		str_format(aMsg, sizeof(aMsg), "#%i %s", Count++, aBuf);
		pThis->Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "net_ban", aMsg);
	}
	for(CBanRange *pBan = pThis->m_BanRangePool.First(); pBan; pBan = pBan->m_pNext)
	{
		pThis->MakeBanInfo(pBan, aBuf, sizeof(aBuf), MSGTYPE_LIST);
		str_format(aMsg, sizeof(aMsg), "#%i %s", Count++, aBuf);
		pThis->Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "net_ban", aMsg);
	}
	str_format(aMsg, sizeof(aMsg), "%d %s", Count, Count==1?"ban":"bans");
	pThis->Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "net_ban", aMsg);
}